

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeSignedLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  void *Decoder_00;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  undefined1 uVar5;
  int64_t offset;
  uint Rn;
  uint Rt;
  _Bool IsFP;
  _Bool IsIndexed;
  _Bool IsLoad;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  ushort uVar6;
  DecodeStatus local_4;
  
  uVar1 = fieldFromInstruction(in_ESI,0,5);
  uVar2 = fieldFromInstruction(in_ESI,5,5);
  uVar3 = fieldFromInstruction(in_ESI,0xc,9);
  Decoder_00 = (void *)(ulong)uVar3;
  if ((uVar3 & 0x100) != 0) {
    Decoder_00 = (void *)((ulong)Decoder_00 | 0xfffffffffffffe00);
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  if ((((((uVar4 - 0x3c6 < 2) || (uVar4 - 0x3cb < 2)) || (uVar4 - 0x3d1 < 2)) ||
       (((uVar4 - 0x3d6 < 2 || (uVar4 - 0x3db < 2)) ||
        ((uVar4 - 0x3e1 < 2 || ((uVar4 - 0x3e6 < 2 || (uVar4 - 0x3eb < 2)))))))) ||
      ((uVar4 - 0x3f0 < 2 ||
       (((((((uVar4 - 0x3f5 < 2 || (uVar4 - 0x3fb < 2)) || (uVar4 - 0x401 < 2)) ||
           ((uVar4 - 0x407 < 2 || (uVar4 - 0x40d < 2)))) || (uVar4 - 0x757 < 2)) ||
         ((uVar4 - 0x75c < 2 || (uVar4 - 0x761 < 2)))) ||
        ((uVar4 - 0x766 < 2 || (((uVar4 - 0x76b < 2 || (uVar4 - 0x770 < 2)) || (uVar4 - 0x775 < 2)))
         ))))))) || ((uVar4 - 0x77a < 2 || (uVar4 - 0x77f < 2)))) {
    DecodeGPR64spRegisterClass
              (in_RCX,in_stack_ffffffffffffffd4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00
              );
  }
  uVar4 = MCInst_getOpcode(in_RDI);
  if (uVar4 - 0x3c6 < 2) goto LAB_002df1f3;
  if (uVar4 - 0x3cb < 2) goto LAB_002df295;
  if (uVar4 - 0x3d1 < 2) goto LAB_002df247;
  if (uVar4 - 0x3d6 < 2) goto LAB_002df1f3;
  if (uVar4 - 0x3db < 2) goto LAB_002df27b;
  if (uVar4 - 0x3e1 < 2) goto LAB_002df22d;
  if (1 < uVar4 - 0x3e6) {
    if (uVar4 - 0x3eb < 2) {
LAB_002df210:
      DecodeGPR64RegisterClass
                (in_RCX,in_stack_ffffffffffffffd4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                 Decoder_00);
      goto LAB_002df2ad;
    }
    if (1 < uVar4 - 0x3f0) {
      if ((uVar4 - 0x3f5 < 2) || (uVar4 - 0x3fb < 2)) goto LAB_002df210;
      if (uVar4 - 0x401 < 2) goto LAB_002df261;
      if (1 < uVar4 - 0x407) {
        if (uVar4 - 0x40d < 2) goto LAB_002df210;
        if (2 < uVar4 - 0x412) {
          if (uVar4 == 0x415) goto LAB_002df210;
          if (uVar4 != 0x416) {
            if (uVar4 - 0x417 < 2) goto LAB_002df210;
            if (uVar4 != 0x419) {
              if (uVar4 == 0x41a) goto LAB_002df210;
              if (uVar4 != 0x41b) {
                if (uVar4 == 0x41c) goto LAB_002df295;
                if (uVar4 == 0x41d) goto LAB_002df247;
                if (uVar4 == 0x41e) goto LAB_002df1f3;
                if (uVar4 == 0x41f) goto LAB_002df27b;
                if (uVar4 == 0x420) goto LAB_002df22d;
                if (uVar4 != 0x421) {
                  if (uVar4 == 0x422) goto LAB_002df210;
                  if (uVar4 != 0x423) {
                    if (uVar4 - 0x424 < 2) goto LAB_002df210;
                    if (uVar4 == 0x426) {
LAB_002df261:
                      DecodeFPR32RegisterClass
                                (in_RCX,in_stack_ffffffffffffffd4,
                                 CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
                      goto LAB_002df2ad;
                    }
                    if (uVar4 == 0x427) goto LAB_002df1f3;
                    if (uVar4 == 0x428) goto LAB_002df210;
                    if (uVar4 == 0x49d) {
                      MCOperand_CreateImm0(in_RDI,(ulong)uVar1);
                      goto LAB_002df2ad;
                    }
                    if (uVar4 - 0x757 < 2) goto LAB_002df1f3;
                    if (uVar4 - 0x75c < 2) {
LAB_002df295:
                      DecodeFPR8RegisterClass
                                (in_RCX,in_stack_ffffffffffffffd4,
                                 CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
                      goto LAB_002df2ad;
                    }
                    if (uVar4 - 0x761 < 2) {
LAB_002df247:
                      DecodeFPR64RegisterClass
                                (in_RCX,in_stack_ffffffffffffffd4,
                                 CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
                      goto LAB_002df2ad;
                    }
                    if (uVar4 - 0x766 < 2) goto LAB_002df1f3;
                    if (uVar4 - 0x76b < 2) {
LAB_002df27b:
                      DecodeFPR16RegisterClass
                                (in_RCX,in_stack_ffffffffffffffd4,
                                 CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
                      goto LAB_002df2ad;
                    }
                    if (uVar4 - 0x770 < 2) {
LAB_002df22d:
                      DecodeFPR128RegisterClass
                                (in_RCX,in_stack_ffffffffffffffd4,
                                 CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
                      goto LAB_002df2ad;
                    }
                    if (uVar4 - 0x775 < 2) goto LAB_002df261;
                    if (1 < uVar4 - 0x77a) {
                      if (uVar4 - 0x77f < 2) goto LAB_002df210;
                      if (2 < uVar4 - 0x784) {
                        if (uVar4 == 0x787) goto LAB_002df210;
                        if (uVar4 != 0x788) {
                          if (uVar4 == 0x789) goto LAB_002df295;
                          if (uVar4 == 0x78a) goto LAB_002df247;
                          if (uVar4 != 0x78b) {
                            if (uVar4 == 0x78c) goto LAB_002df27b;
                            if (uVar4 == 0x78d) goto LAB_002df22d;
                            if (uVar4 == 0x78e) goto LAB_002df261;
                            if (uVar4 != 0x78f) {
                              if (uVar4 != 0x790) {
                                return MCDisassembler_Fail;
                              }
                              goto LAB_002df210;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_002df1f3:
  DecodeGPR32RegisterClass
            (in_RCX,in_stack_ffffffffffffffd4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
LAB_002df2ad:
  DecodeGPR64spRegisterClass
            (in_RCX,in_stack_ffffffffffffffd4,CONCAT44(uVar2,in_stack_ffffffffffffffc8),Decoder_00);
  MCOperand_CreateImm0(in_RDI,(int64_t)Decoder_00);
  uVar3 = fieldFromInstruction(in_ESI,0x16,1);
  uVar5 = uVar3 != 0;
  uVar3 = fieldFromInstruction(in_ESI,10,2);
  uVar6 = CONCAT11(uVar5,uVar3 != 0);
  uVar3 = fieldFromInstruction(in_ESI,0x1a,1);
  if (((((uVar6 & 0x100) == 0) || ((uVar6 & 1) == 0)) || (uVar3 != 0)) ||
     ((uVar2 == 0x1f || (uVar1 != uVar2)))) {
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_SoftFail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSignedLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	bool IsLoad;
	bool IsIndexed;
	bool IsFP;
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	int64_t offset = fieldFromInstruction(insn, 12, 9);

	// offset is a 9-bit signed immediate, so sign extend it to
	// fill the unsigned.
	if (offset & (1 << (9 - 1)))
		offset |= ~((1LL << 9) - 1);

	// First operand is always the writeback to the address register, if needed.
	switch (MCInst_getOpcode(Inst)) {
		default:
			break;
		case AArch64_LDRSBWpre:
		case AArch64_LDRSHWpre:
		case AArch64_STRBBpre:
		case AArch64_LDRBBpre:
		case AArch64_STRHHpre:
		case AArch64_LDRHHpre:
		case AArch64_STRWpre:
		case AArch64_LDRWpre:
		case AArch64_LDRSBWpost:
		case AArch64_LDRSHWpost:
		case AArch64_STRBBpost:
		case AArch64_LDRBBpost:
		case AArch64_STRHHpost:
		case AArch64_LDRHHpost:
		case AArch64_STRWpost:
		case AArch64_LDRWpost:
		case AArch64_LDRSBXpre:
		case AArch64_LDRSHXpre:
		case AArch64_STRXpre:
		case AArch64_LDRSWpre:
		case AArch64_LDRXpre:
		case AArch64_LDRSBXpost:
		case AArch64_LDRSHXpost:
		case AArch64_STRXpost:
		case AArch64_LDRSWpost:
		case AArch64_LDRXpost:
		case AArch64_LDRQpre:
		case AArch64_STRQpre:
		case AArch64_LDRQpost:
		case AArch64_STRQpost:
		case AArch64_LDRDpre:
		case AArch64_STRDpre:
		case AArch64_LDRDpost:
		case AArch64_STRDpost:
		case AArch64_LDRSpre:
		case AArch64_STRSpre:
		case AArch64_LDRSpost:
		case AArch64_STRSpost:
		case AArch64_LDRHpre:
		case AArch64_STRHpre:
		case AArch64_LDRHpost:
		case AArch64_STRHpost:
		case AArch64_LDRBpre:
		case AArch64_STRBpre:
		case AArch64_LDRBpost:
		case AArch64_STRBpost:
			DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_PRFUMi:
			// Rt is an immediate in prefetch.
			MCOperand_CreateImm0(Inst, Rt);
			break;
		case AArch64_STURBBi:
		case AArch64_LDURBBi:
		case AArch64_LDURSBWi:
		case AArch64_STURHHi:
		case AArch64_LDURHHi:
		case AArch64_LDURSHWi:
		case AArch64_STURWi:
		case AArch64_LDURWi:
		case AArch64_LDTRSBWi:
		case AArch64_LDTRSHWi:
		case AArch64_STTRWi:
		case AArch64_LDTRWi:
		case AArch64_STTRHi:
		case AArch64_LDTRHi:
		case AArch64_LDTRBi:
		case AArch64_STTRBi:
		case AArch64_LDRSBWpre:
		case AArch64_LDRSHWpre:
		case AArch64_STRBBpre:
		case AArch64_LDRBBpre:
		case AArch64_STRHHpre:
		case AArch64_LDRHHpre:
		case AArch64_STRWpre:
		case AArch64_LDRWpre:
		case AArch64_LDRSBWpost:
		case AArch64_LDRSHWpost:
		case AArch64_STRBBpost:
		case AArch64_LDRBBpost:
		case AArch64_STRHHpost:
		case AArch64_LDRHHpost:
		case AArch64_STRWpost:
		case AArch64_LDRWpost:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURSBXi:
		case AArch64_LDURSHXi:
		case AArch64_LDURSWi:
		case AArch64_STURXi:
		case AArch64_LDURXi:
		case AArch64_LDTRSBXi:
		case AArch64_LDTRSHXi:
		case AArch64_LDTRSWi:
		case AArch64_STTRXi:
		case AArch64_LDTRXi:
		case AArch64_LDRSBXpre:
		case AArch64_LDRSHXpre:
		case AArch64_STRXpre:
		case AArch64_LDRSWpre:
		case AArch64_LDRXpre:
		case AArch64_LDRSBXpost:
		case AArch64_LDRSHXpost:
		case AArch64_STRXpost:
		case AArch64_LDRSWpost:
		case AArch64_LDRXpost:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURQi:
		case AArch64_STURQi:
		case AArch64_LDRQpre:
		case AArch64_STRQpre:
		case AArch64_LDRQpost:
		case AArch64_STRQpost:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURDi:
		case AArch64_STURDi:
		case AArch64_LDRDpre:
		case AArch64_STRDpre:
		case AArch64_LDRDpost:
		case AArch64_STRDpost:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURSi:
		case AArch64_STURSi:
		case AArch64_LDRSpre:
		case AArch64_STRSpre:
		case AArch64_LDRSpost:
		case AArch64_STRSpost:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURHi:
		case AArch64_STURHi:
		case AArch64_LDRHpre:
		case AArch64_STRHpre:
		case AArch64_LDRHpost:
		case AArch64_STRHpost:
			DecodeFPR16RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDURBi:
		case AArch64_STURBi:
		case AArch64_LDRBpre:
		case AArch64_STRBpre:
		case AArch64_LDRBpost:
		case AArch64_STRBpost:
			DecodeFPR8RegisterClass(Inst, Rt, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	MCOperand_CreateImm0(Inst, offset);

	IsLoad = fieldFromInstruction(insn, 22, 1) != 0;
	IsIndexed = fieldFromInstruction(insn, 10, 2) != 0;
	IsFP = fieldFromInstruction(insn, 26, 1) != 0;

	// Cannot write back to a transfer register (but xzr != sp).
	if (IsLoad && IsIndexed && !IsFP && Rn != 31 && Rt == Rn)
		return SoftFail;

	return Success;
}